

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# polygon.cpp
# Opt level: O0

void __thiscall masc::polygon::c_ply::delete_vertex(c_ply *this,ply_vertex *v)

{
  int iVar1;
  undefined4 extraout_var;
  ply_vertex *n;
  ply_vertex *next;
  ply_vertex *pre;
  ply_vertex *v_local;
  c_ply *this_local;
  ply_vertex *this_00;
  undefined4 extraout_var_00;
  
  iVar1 = (*v->_vptr_ply_vertex[4])();
  this_00 = (ply_vertex *)CONCAT44(extraout_var,iVar1);
  iVar1 = (*v->_vptr_ply_vertex[3])();
  n = (ply_vertex *)CONCAT44(extraout_var_00,iVar1);
  ply_vertex::setNext(this_00,n);
  ply_vertex::setPre(n,this_00);
  ply_vertex::computeExtraInfo(this_00);
  if (this->head == v) {
    this->head = n;
    this->tail = this_00;
  }
  if (v != (ply_vertex *)0x0) {
    (*v->_vptr_ply_vertex[1])();
  }
  std::vector<masc::polygon::ply_vertex_*,_std::allocator<masc::polygon::ply_vertex_*>_>::clear
            (&this->all);
  return;
}

Assistant:

void c_ply::delete_vertex(ply_vertex * v)
{
    ply_vertex *pre=v->getPre();
    ply_vertex *next=v->getNext();

    pre->setNext(next);
    next->setPre(pre);
    pre->computeExtraInfo(); //recompute info

    if(head==v){
        head=next;
        tail=pre;
    }
    delete v;

    all.clear(); //not valid anymore
}